

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_base.cpp
# Opt level: O3

ssize_t __thiscall ximu::ReaderBase::read(ReaderBase *this,int __fd,void *__buf,size_t __nbytes)

{
  ulong uVar1;
  _Map_pointer ppuVar2;
  _Map_pointer ppuVar3;
  uchar *puVar4;
  uchar *puVar5;
  ulong uVar6;
  _Map_pointer extraout_RAX;
  long lVar7;
  uchar *puVar8;
  uchar *puVar9;
  ulong uVar10;
  uchar *puVar11;
  uchar *puVar12;
  long lVar13;
  _Map_pointer ppuVar14;
  uchar *puVar15;
  iterator local_f0;
  _Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*> local_d0;
  uchar *local_b0;
  uchar *local_a8;
  _Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*> local_a0;
  iterator local_80;
  iterator local_60;
  deque<unsigned_char,_std::allocator<unsigned_char>_> *local_40;
  ReaderBase *local_38;
  
  local_40 = &this->_buffer;
  local_38 = this;
  do {
    ppuVar2 = (this->_buffer).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node;
    ppuVar3 = (this->_buffer).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Deque_impl_data._M_start._M_node;
    lVar13 = (((ulong)((long)ppuVar2 - (long)ppuVar3) >> 3) - (ulong)(ppuVar2 != (_Map_pointer)0x0))
             * 0x200;
    local_b0 = (this->_buffer).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_cur;
    puVar4 = (this->_buffer).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Deque_impl_data._M_start._M_cur;
    puVar5 = (this->_buffer).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Deque_impl_data._M_start._M_last;
    lVar7 = (long)local_b0 -
            (long)(this->_buffer).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_first;
    puVar8 = puVar5 + lVar7;
    puVar9 = puVar8 + (lVar13 - (long)puVar4);
    if (puVar9 < (uchar *)0x5) {
      return (ssize_t)ppuVar3;
    }
    local_a8 = (this->_buffer).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Deque_impl_data._M_start._M_first;
    puVar11 = puVar5;
    puVar12 = local_a8;
    ppuVar14 = ppuVar3;
    puVar15 = puVar4;
    if (0 < (long)puVar9 >> 2) {
      lVar13 = ((long)puVar9 >> 2) + 1;
      do {
        if ((char)*puVar15 < '\0') goto LAB_00106319;
        puVar15 = puVar15 + 1;
        if (puVar15 == puVar11) {
          puVar12 = ppuVar14[1];
          ppuVar14 = ppuVar14 + 1;
          puVar11 = puVar12 + 0x200;
          puVar15 = puVar12;
        }
        if ((char)*puVar15 < '\0') goto LAB_00106319;
        puVar15 = puVar15 + 1;
        if (puVar15 == puVar11) {
          puVar12 = ppuVar14[1];
          ppuVar14 = ppuVar14 + 1;
          puVar11 = puVar12 + 0x200;
          puVar15 = puVar12;
        }
        if ((char)*puVar15 < '\0') goto LAB_00106319;
        puVar15 = puVar15 + 1;
        if (puVar15 == puVar11) {
          puVar12 = ppuVar14[1];
          ppuVar14 = ppuVar14 + 1;
          puVar11 = puVar12 + 0x200;
          puVar15 = puVar12;
        }
        if ((char)*puVar15 < '\0') goto LAB_00106319;
        puVar15 = puVar15 + 1;
        if (puVar15 == puVar11) {
          puVar12 = ppuVar14[1];
          ppuVar14 = ppuVar14 + 1;
          puVar11 = puVar12 + 0x200;
          puVar15 = puVar12;
        }
        lVar13 = lVar13 + -1;
      } while (1 < lVar13);
      puVar8 = puVar11 + lVar7;
      lVar13 = (((ulong)((long)ppuVar2 - (long)ppuVar14) >> 3) -
               (ulong)(ppuVar2 != (_Map_pointer)0x0)) * 0x200;
    }
    puVar8 = puVar8 + (lVar13 - (long)puVar15);
    if (puVar8 == (uchar *)0x1) {
LAB_0010630e:
      if (-1 < (char)*puVar15) goto LAB_0010651b;
    }
    else if (puVar8 == (uchar *)0x2) {
LAB_001062ec:
      if (-1 < (char)*puVar15) {
        puVar15 = puVar15 + 1;
        if (puVar15 == puVar11) {
          puVar12 = ppuVar14[1];
          ppuVar14 = ppuVar14 + 1;
          puVar11 = puVar12 + 0x200;
          puVar15 = puVar12;
        }
        goto LAB_0010630e;
      }
    }
    else {
      if (puVar8 != (uchar *)0x3) goto LAB_0010651b;
      if (-1 < (char)*puVar15) {
        puVar15 = puVar15 + 1;
        if (puVar15 == puVar11) {
          puVar12 = ppuVar14[1];
          ppuVar14 = ppuVar14 + 1;
          puVar11 = puVar12 + 0x200;
          puVar15 = puVar12;
        }
        goto LAB_001062ec;
      }
    }
LAB_00106319:
    if (puVar15 == local_b0) {
LAB_0010651b:
      if (puVar9 < (uchar *)0x1f) {
        return (ssize_t)ppuVar3;
      }
      std::deque<unsigned_char,_std::allocator<unsigned_char>_>::clear(local_40);
      return (ssize_t)extraout_RAX;
    }
    if (puVar5 + (long)puVar15 +
        ((((ulong)((long)ppuVar14 - (long)ppuVar3) >> 3) - 1) +
        (ulong)(ppuVar14 == (_Map_pointer)0x0)) * 0x200 + (-(long)puVar12 - (long)puVar4) + -0x1f <
        (uchar *)0xffffffffffffffe5) {
      uVar1 = ((long)puVar15 - (long)puVar12) + 1;
      if ((long)puVar15 - (long)puVar12 < -1) {
        uVar10 = (long)uVar1 >> 9;
LAB_001063ee:
        ppuVar14 = ppuVar14 + uVar10;
        local_60._M_cur = *ppuVar14 + uVar1 + uVar10 * -0x200;
      }
      else {
        if (0x1ff < uVar1) {
          uVar10 = uVar1 >> 9;
          goto LAB_001063ee;
        }
        local_60._M_cur = puVar15 + 1;
      }
      local_80._M_first = *ppuVar3;
      local_60._M_first = *ppuVar14;
      local_80._M_cur = puVar4;
      local_80._M_node = ppuVar3;
    }
    else {
      lVar7 = (long)puVar15 - (long)puVar12;
      uVar1 = lVar7 + 1;
      uVar6 = (long)uVar1 >> 9;
      uVar10 = uVar6;
      if (lVar7 < -1) {
LAB_00106437:
        local_a0._M_node = ppuVar14 + uVar10;
        local_a0._M_first = *local_a0._M_node;
        local_a0._M_last = local_a0._M_first + 0x200;
        local_a0._M_cur = local_a0._M_first + uVar1 + uVar10 * -0x200;
      }
      else {
        if (0x1ff < uVar1) {
          uVar10 = uVar1 >> 9;
          goto LAB_00106437;
        }
        local_a0._M_cur = puVar15 + 1;
        local_a0._M_first = puVar12;
        local_a0._M_last = puVar11;
        local_a0._M_node = ppuVar14;
      }
      local_d0._M_cur = puVar4;
      local_d0._M_first = local_a8;
      local_d0._M_last = puVar5;
      local_d0._M_node = ppuVar3;
      PacketReader::read<std::_Deque_iterator<unsigned_char,unsigned_char&,unsigned_char*>>
                (&local_38->super_PacketReader,&local_d0,&local_a0);
      if (lVar7 < -1) {
LAB_001064b1:
        ppuVar14 = ppuVar14 + uVar6;
        local_60._M_cur = *ppuVar14 + uVar1 + uVar6 * -0x200;
      }
      else {
        if (0x1ff < uVar1) {
          uVar6 = uVar1 >> 9;
          goto LAB_001064b1;
        }
        local_60._M_cur = puVar15 + 1;
      }
      local_80._M_cur =
           (local_38->_buffer).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Deque_impl_data._M_start._M_cur;
      local_80._M_node =
           (local_38->_buffer).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Deque_impl_data._M_start._M_node;
      local_80._M_first = *local_80._M_node;
      local_60._M_first = *ppuVar14;
    }
    this = local_38;
    local_80._M_last = local_80._M_first + 0x200;
    local_60._M_last = local_60._M_first + 0x200;
    local_60._M_node = ppuVar14;
    std::deque<unsigned_char,_std::allocator<unsigned_char>_>::_M_erase
              (&local_f0,local_40,&local_80,&local_60);
  } while( true );
}

Assistant:

void ReaderBase::read() {
  bool done = false;

  // todo @aukedirk no-magic numbers
  while (_buffer.size() > 4 && !done) {

      // locate potential header byte
    auto frameBuffer = std::find_if(
        _buffer.begin(), _buffer.end(), isFrameBuffer);

    // we did not find the framebuffer
    if (frameBuffer == _buffer.end())
    {
        if (_buffer.size() > 30)
            _buffer.clear();
        return;
    }

    // All messages are between 4 and 30 bytes
    size_t msgLength = std::distance(_buffer.begin(),frameBuffer);
    if (msgLength < 4 || msgLength > 30)
    {
        _buffer.erase(_buffer.begin(), frameBuffer + 1);
    }
    else
    {
        //  todo @auke-dirk investigate enum
        //  pass to the packetreader
        switch (PacketReader::read(_buffer.begin(), frameBuffer + 1)) {
          case PacketReader::INVALID_CHECKSUM:
          case PacketReader::OKE:
          case PacketReader::INVALID_PACKET_SIZE:
            _buffer.erase(_buffer.begin(), frameBuffer + 1);
            break;
          default:
            _buffer.erase(_buffer.begin(), frameBuffer + 1);
        }
    }
  }
}